

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void BuildVarList(SstStream Stream,TSMetadataMsg MetaData,int WriterRank)

{
  FFSVarRec_conflict pFVar1;
  SstStream Stream_00;
  int iVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  size_t __size;
  char *pcVar6;
  FMFormat Format_00;
  ulong *puVar7;
  uint in_EDX;
  long in_RSI;
  SstStream in_RDI;
  void *Variable;
  size_t *Offsets;
  int i_1;
  MetaArrayRec *meta_base;
  void *field_data;
  FFSVarRec_conflict VarRec;
  int FieldOffset;
  int i;
  ControlStruct *ControlArray;
  ControlInfo *Control;
  size_t DecodedLength;
  FMStructDescList List;
  FMFormat Format;
  FMContext FMC;
  FFSReaderMarshalBase *Info;
  void *BaseData;
  FFSTypeHandle FFSformat;
  size_t *in_stack_ffffffffffffff38;
  FFSMetadataInfoStruct *in_stack_ffffffffffffff40;
  size_t local_b0;
  size_t *local_90;
  int local_84;
  undefined4 in_stack_ffffffffffffff98;
  int iVar8;
  undefined4 in_stack_ffffffffffffff9c;
  SstStream in_stack_ffffffffffffffa0;
  ControlStruct *pCVar9;
  ControlInfo *local_58;
  void *local_30;
  void *local_28;
  undefined8 local_20;
  uint local_14;
  long local_10;
  SstStream local_8;
  
  local_30 = in_RDI->ReaderMarshalData;
  local_90 = in_stack_ffffffffffffff38;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_30 == (void *)0x0) {
    local_30 = malloc(0x50);
    memset(local_30,0,0x50);
    local_8->ReaderMarshalData = local_30;
    pvVar4 = calloc(0x18,(long)local_8->WriterCohortSize);
    *(void **)((long)local_30 + 0x40) = pvVar4;
    pvVar4 = calloc(8,(long)local_8->WriterCohortSize);
    *(void **)((long)local_30 + 0x20) = pvVar4;
    pvVar4 = calloc(8,(long)local_8->WriterCohortSize);
    *(void **)((long)local_30 + 0x28) = pvVar4;
    pvVar4 = calloc(8,(long)local_8->WriterCohortSize);
    *(void **)((long)local_30 + 0x30) = pvVar4;
    pvVar4 = calloc(8,(long)local_8->WriterCohortSize);
    *(void **)((long)local_30 + 0x38) = pvVar4;
    local_90 = in_stack_ffffffffffffff38;
  }
  if (*(long *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8) == 0) {
    fprintf(_stderr,"FAILURE!   MetaData->Metadata[WriterRank]->block == NULL for WriterRank = %d\n"
            ,(ulong)local_14);
  }
  local_20 = FFSTypeHandle_from_encode
                       (local_8->ReaderFFSContext,
                        *(undefined8 *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8)
                       );
  iVar2 = FFShas_conversion(local_20);
  if (iVar2 == 0) {
    uVar5 = FMContext_from_FFS(local_8->ReaderFFSContext);
    uVar5 = FMformat_from_ID(uVar5,*(undefined8 *)
                                    (*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8));
    uVar5 = format_list_of_FMFormat(uVar5);
    uVar5 = FMcopy_struct_list(uVar5);
    FMlocalize_structs(uVar5);
    establish_conversion(local_8->ReaderFFSContext,local_20,uVar5);
    FMfree_struct_list(uVar5);
  }
  iVar2 = FFSdecode_in_place_possible(local_20);
  if (iVar2 == 0) {
    __size = FFS_est_decode_length
                       (local_8->ReaderFFSContext,
                        *(undefined8 *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8)
                        ,*(undefined8 *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10));
    local_28 = malloc(__size);
    FFSdecode_to_buffer(local_8->ReaderFFSContext,
                        *(undefined8 *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8)
                        ,local_28);
  }
  else {
    FFSdecode_in_place(local_8->ReaderFFSContext,
                       *(undefined8 *)(*(long *)(local_10 + 0x20) + (long)(int)local_14 * 0x10 + 8),
                       &local_28);
  }
  if (BuildVarList::DumpMetadata == -1) {
    pcVar6 = getenv("SstDumpMetadata");
    BuildVarList::DumpMetadata = (int)(pcVar6 != (char *)0x0);
  }
  if ((BuildVarList::DumpMetadata != 0) && (local_8->Rank == 0)) {
    printf("\nIncomingMetadatablock from WriterRank %d is %p :\n",(ulong)local_14,local_28);
    uVar5 = FMFormat_of_original(local_20);
    FMdump_data(uVar5,local_28,0xfa000);
    printf("\n\n");
  }
  Stream_00 = local_8;
  Format_00 = (FMFormat)FMFormat_of_original(local_20);
  local_58 = GetPriorControl(Stream_00,Format_00);
  if (local_58 == (ControlInfo *)0x0) {
    FMFormat_of_original(local_20);
    local_58 = BuildControl(in_stack_ffffffffffffffa0,
                            (FMFormat)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
  }
  pCVar9 = local_58->Controls;
  *(void **)(*(long *)((long)local_30 + 0x20) + (long)(int)local_14 * 8) = local_28;
  for (iVar2 = 0; iVar2 < local_58->ControlCount; iVar2 = iVar2 + 1) {
    iVar8 = pCVar9[iVar2].FieldOffset;
    pFVar1 = pCVar9[iVar2].VarRec;
    puVar7 = (ulong *)((long)local_28 + (long)iVar8);
    iVar3 = FFSBitfieldTest(in_stack_ffffffffffffff40,(int)((ulong)local_90 >> 0x20));
    if (iVar3 != 0) {
      if (pCVar9[iVar2].IsArray == 0) {
        if (pFVar1->Variable == (void *)0x0) {
          pvVar4 = (*local_8->VarSetupUpcall)
                             (local_8->SetupUpcallReader,pFVar1->VarName,pFVar1->Type,puVar7);
          pFVar1->Variable = pvVar4;
        }
      }
      else {
        if ((1 < *puVar7) &&
           (local_8->WriterConfigParams->IsRowMajor != local_8->ConfigParams->IsRowMajor)) {
          ReverseDimensions((size_t *)puVar7[2],(int)*puVar7);
          ReverseDimensions((size_t *)puVar7[3],(int)*puVar7);
          ReverseDimensions((size_t *)puVar7[4],(int)*puVar7);
        }
        if (local_14 == 0) {
          pFVar1->GlobalDims = (size_t *)puVar7[2];
        }
        if (pFVar1->Variable == (void *)0x0) {
          local_90 = (size_t *)puVar7[3];
          pvVar4 = (*local_8->ArraySetupUpcall)
                             (local_8->SetupUpcallReader,pFVar1->VarName,pFVar1->Type,(int)*puVar7,
                              (size_t *)puVar7[2],(size_t *)puVar7[4],local_90);
          pFVar1->Variable = pvVar4;
        }
        pFVar1->DimCount = *puVar7;
        if (*puVar7 == 0) {
          local_b0 = 1;
        }
        else {
          local_b0 = puVar7[1] / *puVar7;
        }
        pFVar1->PerWriterBlockCount[(int)local_14] = local_b0;
        pFVar1->PerWriterStart[(int)local_14] = (size_t *)puVar7[4];
        pFVar1->PerWriterCounts[(int)local_14] = (size_t *)puVar7[3];
        if (local_14 == 0) {
          *pFVar1->PerWriterBlockStart = 0;
        }
        if ((int)local_14 < local_8->WriterCohortSize + -1) {
          pFVar1->PerWriterBlockStart[(int)(local_14 + 1)] =
               pFVar1->PerWriterBlockStart[(int)local_14] +
               pFVar1->PerWriterBlockCount[(int)local_14];
        }
        if (BuildVarList::UseMin == -1) {
          pcVar6 = getenv("OldBlocksInfo");
          BuildVarList::UseMin = (int)(pcVar6 != (char *)0x0);
        }
        if (BuildVarList::UseMin == 0) {
          for (local_84 = 0; (ulong)(long)local_84 < pFVar1->PerWriterBlockCount[(int)local_14];
              local_84 = local_84 + 1) {
            local_90 = (size_t *)0x0;
            if (puVar7[4] != 0) {
              local_90 = (size_t *)(puVar7[4] + (long)local_84 * *puVar7 * 8);
            }
            in_stack_ffffffffffffff40 = (FFSMetadataInfoStruct *)puVar7[3];
            (*local_8->ArrayBlocksInfoUpcall)
                      (local_8->SetupUpcallReader,pFVar1->Variable,pFVar1->Type,local_14,
                       (int)*puVar7,(size_t *)puVar7[2],local_90,(size_t *)in_stack_ffffffffffffff40
                      );
          }
        }
      }
      pFVar1->PerWriterMetaFieldOffset[(int)local_14] = (long)iVar8;
    }
  }
  return;
}

Assistant:

static void BuildVarList(SstStream Stream, TSMetadataMsg MetaData, int WriterRank)
{
    FFSTypeHandle FFSformat;
    void *BaseData;
    static int DumpMetadata = -1;

    /* incoming metadata is all of our information about what was written
     * and is available to be read.  We'll process the data from each node
     * separately, but in such a way that we don't need to process the
     * MetaData again.  That means keeping around the information that we'll
     * need to respond to Get[Sync,Deferred] actions later.  For this we use
     * the VarList, which is keyed by the address of the Variable object
     * created at the ADIOS2 level.  So, we run through the individual
     * metadata blocks from a rank.  For each field set (one field for
     * atomic values, 4 for arrays), we look to see if we that name already
     * exists in the VarList (never for WriterRank==0), and if not we create
     * it and do the upcall to create the Variable object.  Then for each
     * Variable, we note global geometry, and for each rank we note the
     * FMField descriptor for its entry in the MetaData block and the
     * geometry for that block (Start + Offset arrays).  Also for each rank
     * we track the info that we'll need later (base address of decoded
     * metadata), format lists /buffers that might need freeing, etc.
     */

    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    if (!Info)
    {
        Info = malloc(sizeof(*Info));
        memset(Info, 0, sizeof(*Info));
        Stream->ReaderMarshalData = Info;
        Info->WriterInfo = calloc(sizeof(Info->WriterInfo[0]), Stream->WriterCohortSize);
        Info->MetadataBaseAddrs =
            calloc(sizeof(Info->MetadataBaseAddrs[0]), Stream->WriterCohortSize);
        Info->MetadataFieldLists =
            calloc(sizeof(Info->MetadataFieldLists[0]), Stream->WriterCohortSize);
        Info->DataBaseAddrs = calloc(sizeof(Info->DataBaseAddrs[0]), Stream->WriterCohortSize);
        Info->DataFieldLists = calloc(sizeof(Info->DataFieldLists[0]), Stream->WriterCohortSize);
    }

    if (!MetaData->Metadata[WriterRank].block)
    {
        fprintf(stderr,
                "FAILURE!   MetaData->Metadata[WriterRank]->block == "
                "NULL for WriterRank = %d\n",
                WriterRank);
    }
    FFSformat =
        FFSTypeHandle_from_encode(Stream->ReaderFFSContext, MetaData->Metadata[WriterRank].block);

    if (!FFShas_conversion(FFSformat))
    {
        FMContext FMC = FMContext_from_FFS(Stream->ReaderFFSContext);
        FMFormat Format = FMformat_from_ID(FMC, MetaData->Metadata[WriterRank].block);
        FMStructDescList List = FMcopy_struct_list(format_list_of_FMFormat(Format));
        FMlocalize_structs(List);
        establish_conversion(Stream->ReaderFFSContext, FFSformat, List);
        FMfree_struct_list(List);
    }

    if (FFSdecode_in_place_possible(FFSformat))
    {
        FFSdecode_in_place(Stream->ReaderFFSContext, MetaData->Metadata[WriterRank].block,
                           &BaseData);
    }
    else
    {
        size_t DecodedLength =
            FFS_est_decode_length(Stream->ReaderFFSContext, MetaData->Metadata[WriterRank].block,
                                  MetaData->Metadata[WriterRank].DataSize);
        BaseData = malloc(DecodedLength);
        FFSdecode_to_buffer(Stream->ReaderFFSContext, MetaData->Metadata[WriterRank].block,
                            BaseData);
    }
    if (DumpMetadata == -1)
    {
        DumpMetadata = (getenv("SstDumpMetadata") != NULL);
    }
    if (DumpMetadata && (Stream->Rank == 0))
    {
        printf("\nIncomingMetadatablock from WriterRank %d is %p :\n", WriterRank, BaseData);
        FMdump_data(FMFormat_of_original(FFSformat), BaseData, 1024000);
        printf("\n\n");
    }
    struct ControlInfo *Control;
    struct ControlStruct *ControlArray;
    Control = GetPriorControl(Stream, FMFormat_of_original(FFSformat));
    if (!Control)
    {
        Control = BuildControl(Stream, FMFormat_of_original(FFSformat));
    }
    ControlArray = &Control->Controls[0];

    Info->MetadataBaseAddrs[WriterRank] = BaseData;
    for (int i = 0; i < Control->ControlCount; i++)
    {
        int FieldOffset = ControlArray[i].FieldOffset;
        FFSVarRec VarRec = ControlArray[i].VarRec;
        void *field_data = (char *)BaseData + FieldOffset;
        if (!FFSBitfieldTest(BaseData, i))
        {
            continue;
        }
        if (ControlArray[i].IsArray)
        {
            MetaArrayRec *meta_base = field_data;
            if ((meta_base->Dims > 1) &&
                (Stream->WriterConfigParams->IsRowMajor != Stream->ConfigParams->IsRowMajor))
            {
                /* if we're getting data from someone of the other array gender,
                 * switcheroo */
                ReverseDimensions(meta_base->Shape, (int)meta_base->Dims);
                ReverseDimensions(meta_base->Count, (int)meta_base->Dims);
                ReverseDimensions(meta_base->Offsets, (int)meta_base->Dims);
            }
            if (WriterRank == 0)
            {
                VarRec->GlobalDims = meta_base->Shape;
            }
            if (!VarRec->Variable)
            {
                VarRec->Variable = Stream->ArraySetupUpcall(
                    Stream->SetupUpcallReader, VarRec->VarName, VarRec->Type, (int)meta_base->Dims,
                    meta_base->Shape, meta_base->Offsets, meta_base->Count);
            }
            VarRec->DimCount = meta_base->Dims;
            VarRec->PerWriterBlockCount[WriterRank] =
                meta_base->Dims ? meta_base->DBCount / meta_base->Dims : 1;
            VarRec->PerWriterStart[WriterRank] = meta_base->Offsets;
            VarRec->PerWriterCounts[WriterRank] = meta_base->Count;
            if (WriterRank == 0)
            {
                VarRec->PerWriterBlockStart[WriterRank] = 0;
            }
            if (WriterRank < Stream->WriterCohortSize - 1)
            {
                VarRec->PerWriterBlockStart[WriterRank + 1] =
                    VarRec->PerWriterBlockStart[WriterRank] +
                    VarRec->PerWriterBlockCount[WriterRank];
            }
            static int UseMin = 1;
            if (UseMin == -1)
            {
                if (getenv("OldBlocksInfo") == NULL)
                {
                    UseMin = 0;
                }
                else
                {
                    UseMin = 1;
                }
            }
            if (!UseMin)
            {
                for (int i = 0; i < VarRec->PerWriterBlockCount[WriterRank]; i++)
                {
                    size_t *Offsets = NULL;
                    if (meta_base->Offsets)
                        Offsets = meta_base->Offsets + (i * meta_base->Dims);
                    void *Variable = VarRec->Variable;
                    Stream->ArrayBlocksInfoUpcall(Stream->SetupUpcallReader, Variable, VarRec->Type,
                                                  WriterRank, (int)meta_base->Dims,
                                                  meta_base->Shape, Offsets, meta_base->Count);
                }
            }
        }
        else
        {
            if (!VarRec->Variable)
            {
                VarRec->Variable = Stream->VarSetupUpcall(
                    Stream->SetupUpcallReader, VarRec->VarName, VarRec->Type, field_data);
            }
        }
        VarRec->PerWriterMetaFieldOffset[WriterRank] = FieldOffset;
    }
}